

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_phantasm(CHAR_DATA *mob)

{
  int iVar1;
  CHAR_DATA *in_RDI;
  char *spell;
  int sn;
  CHAR_DATA *victim;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  char *ch;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  CHAR_DATA *format;
  
  format = in_RDI->fighting;
  uVar2 = 0;
  ch = (char *)0x0;
  if ((format != (CHAR_DATA *)0x0) && (iVar1 = number_percent(), iVar1 < 0xb)) {
    iVar1 = number_range((int)ch,in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)(ulong)in_stack_ffffffffffffffd8,0);
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      LAG_CHAR((CHAR_DATA *)ch,iVar1);
    }
    else if (iVar1 - 1U < 3) {
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      ch = "curse";
    }
    else if (iVar1 - 4U < 2) {
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      act((char *)format,(CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),ch,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
      ch = "forget";
    }
    if (((CHAR_DATA *)ch != (CHAR_DATA *)0x0) &&
       (iVar1 = skill_lookup((char *)CONCAT44(uVar2,in_stack_ffffffffffffffe8)), -1 < iVar1)) {
      (*skill_table[iVar1].spell_fun)(iVar1,in_RDI->level + 1,in_RDI,format,0);
    }
  }
  return;
}

Assistant:

void pulse_prog_phantasm(CHAR_DATA *mob)
{
	CHAR_DATA *victim = mob->fighting;
	int sn = 0;
	char *spell = nullptr;

	if (!victim || number_percent() > 10)
		return;

	switch (number_range(0, 5))
	{
		case 0:
			act("$n shows you the face of your worst nightmare, paralyzing you with fear!", mob, 0, victim, TO_VICT);
			act("$n's ghostly form flickers briefly as $N flinches away in terror.", mob, 0, victim, TO_NOTVICT);

			LAG_CHAR(victim, PULSE_VIOLENCE * 3);
			break;
		case 1:
		case 2:
		case 3:
			act("Your death flashes before your eyes.", 0, 0, victim, TO_VICT);
			act("You feel hope slip away.", 0, 0, victim, TO_VICT);
			act("$N gets a look of hopelessness on $S face.", mob, 0, victim, TO_NOTVICT);

			spell = "curse";
			break;
		case 4:
		case 5:
			act("$n runs $s fingers down $N's face gently.", mob, 0, victim, TO_NOTVICT);
			act("$n runs $s fingers down your face gently.", mob, 0, victim, TO_VICT);
			act("$n plunges $s spectral hand into $N's head, leaving $M looking confused.", mob, 0, victim, TO_NOTVICT);
			act("$n plunges $s spectral hand into your head, leaving you feeling confused.", mob, 0, victim, TO_VICT);

			spell = "forget";
			break;
	}

	if (!spell || (sn = skill_lookup(spell)) < 0)
		return;

	(*skill_table[sn].spell_fun)(sn, mob->level + 1, mob, victim, TARGET_CHAR);
}